

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<capnp::AnyPointer::Pipeline> * __thiscall
kj::_::NullableValue<capnp::AnyPointer::Pipeline>::operator=
          (NullableValue<capnp::AnyPointer::Pipeline> *this,
          NullableValue<capnp::AnyPointer::Pipeline> *other)

{
  Pipeline *params;
  NullableValue<capnp::AnyPointer::Pipeline> *other_local;
  NullableValue<capnp::AnyPointer::Pipeline> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<capnp::AnyPointer::Pipeline>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<capnp::AnyPointer::Pipeline>(&(other->field_1).value);
      ctor<capnp::AnyPointer::Pipeline,capnp::AnyPointer::Pipeline>(&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }